

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::UnloadDocument(Context *this,ElementDocument *_document)

{
  bool bVar1;
  ElementDocument *pEVar2;
  reference this_00;
  pointer pEVar3;
  Element *pEVar4;
  ElementDocument *pEVar5;
  reference ppEVar6;
  const_iterator local_88;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_80;
  Element **local_78;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_70;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_68;
  iterator itr;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_48;
  ElementDocument *local_28;
  ElementDocument *document;
  size_t i;
  ElementDocument *_document_local;
  Context *this_local;
  
  document = (ElementDocument *)0x0;
  i = (size_t)_document;
  _document_local = (ElementDocument *)this;
  while( true ) {
    pEVar5 = document;
    pEVar2 = (ElementDocument *)
             ::std::
             vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ::size(&this->unloaded_documents);
    if (pEVar2 <= pEVar5) {
      local_28 = (ElementDocument *)i;
      pEVar4 = Element::GetParentNode((Element *)i);
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&this->root);
      pEVar5 = local_28;
      if (pEVar4 == pEVar3) {
        local_48.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::flat_map(&local_48);
        Element::DispatchEvent(&pEVar5->super_Element,Unload,&local_48);
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::~flat_map(&local_48);
        PluginRegistry::NotifyDocumentUnload(local_28);
        pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                           (&this->root);
        Element::RemoveChild((Element *)&itr,pEVar3);
        ::std::
        vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
        ::push_back(&this->unloaded_documents,(value_type *)&itr);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&itr);
      }
      local_70._M_current =
           (Element **)
           ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::begin
                     (&this->document_focus_history);
      local_78 = (Element **)
                 ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::end
                           (&this->document_focus_history);
      local_68 = ::std::
                 find<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,Rml::ElementDocument*>
                           (local_70,(__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                                      )local_78,&local_28);
      local_80._M_current =
           (Element **)
           ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::end
                     (&this->document_focus_history);
      bVar1 = __gnu_cxx::operator!=(&local_68,&local_80);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
        ::__normal_iterator<Rml::Element**>
                  ((__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                    *)&local_88,&local_68);
        ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::erase
                  (&this->document_focus_history,local_88);
      }
      if ((this->focus != (Element *)0x0) &&
         (pEVar5 = Element::GetOwnerDocument(this->focus), pEVar5 == local_28)) {
        this->focus = (Element *)0x0;
        ppEVar6 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::back
                            (&this->document_focus_history);
        pEVar4 = Element::GetFocusLeafNode(*ppEVar6);
        Element::Focus(pEVar4,false);
      }
      if ((this->active != (Element *)0x0) &&
         (pEVar5 = Element::GetOwnerDocument(this->active), pEVar5 == local_28)) {
        this->active = (Element *)0x0;
      }
      if ((this->drag != (Element *)0x0) &&
         (pEVar5 = Element::GetOwnerDocument(this->drag), pEVar5 == local_28)) {
        this->drag = (Element *)0x0;
        ReleaseDragClone(this);
      }
      if ((this->drag_hover != (Element *)0x0) &&
         (pEVar5 = Element::GetOwnerDocument(this->drag_hover), pEVar5 == local_28)) {
        this->drag_hover = (Element *)0x0;
      }
      UpdateHoverChain(this,this->mouse_position,0,(Dictionary *)0x0,(Dictionary *)0x0);
      return;
    }
    this_00 = ::std::
              vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
              ::operator[](&this->unloaded_documents,(size_type)document);
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(this_00);
    if (pEVar3 == (pointer)i) break;
    document = (ElementDocument *)
               ((long)&(document->super_Element).super_ScriptInterface.super_Releasable.
                       _vptr_Releasable + 1);
  }
  return;
}

Assistant:

void Context::UnloadDocument(ElementDocument* _document)
{
	// Has this document already been unloaded?
	for (size_t i = 0; i < unloaded_documents.size(); ++i)
	{
		if (unloaded_documents[i].get() == _document)
			return;
	}

	ElementDocument* document = _document;

	if (document->GetParentNode() == root.get())
	{
		// Dispatch the unload notifications.
		document->DispatchEvent(EventId::Unload, Dictionary());
		PluginRegistry::NotifyDocumentUnload(document);

		// Move document to a temporary location to be released later.
		unloaded_documents.push_back(root->RemoveChild(document));
	}

	// Remove the item from the focus history.
	ElementList::iterator itr = std::find(document_focus_history.begin(), document_focus_history.end(), document);
	if (itr != document_focus_history.end())
		document_focus_history.erase(itr);

	// Focus to the previous document if the old document is the current focus.
	if (focus && focus->GetOwnerDocument() == document)
	{
		focus = nullptr;
		document_focus_history.back()->GetFocusLeafNode()->Focus();
	}

	// Clear the active element if the old document is the active element.
	if (active && active->GetOwnerDocument() == document)
	{
		active = nullptr;
	}

	// Clear other pointers to elements whose owner was deleted
	if (drag && drag->GetOwnerDocument() == document)
	{
		drag = nullptr;
		ReleaseDragClone();
	}

	if (drag_hover && drag_hover->GetOwnerDocument() == document)
	{
		drag_hover = nullptr;
	}

	// Rebuild the hover state.
	UpdateHoverChain(mouse_position);
}